

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_hash_element **ppCVar1;
  size_t sVar2;
  Curl_hash_element *local_30;
  Curl_hash_element *he;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  if (h->table != (Curl_hash_element **)0x0) {
    ppCVar1 = h->table;
    sVar2 = (*h->hash_func)(key,key_len,h->slots);
    for (local_30 = ppCVar1[sVar2]; local_30 != (Curl_hash_element *)0x0; local_30 = local_30->next)
    {
      sVar2 = (*h->comp_func)(local_30->key,local_30->key_len,key,key_len);
      if (sVar2 != 0) {
        return local_30->ptr;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_hash_element *he;
    DEBUGASSERT(h->slots);
    he = CURL_HASH_SLOT(h, key, key_len);
    while(he) {
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
      he = he->next;
    }
  }
  return NULL;
}